

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLAbstractDoubleFloat.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::XMLAbstractDoubleFloat::serialize
          (XMLAbstractDoubleFloat *this,XSerializeEngine *serEng)

{
  uint in_EAX;
  int type;
  undefined8 uStack_28;
  
  uStack_28._0_4_ = in_EAX;
  XMLNumber::serialize(&this->super_XMLNumber,serEng);
  if (serEng->fStoreLoad != 0) {
    XSerializeEngine::operator>>(serEng,&this->fValue);
    uStack_28 = (ulong)(uint)uStack_28;
    XSerializeEngine::operator>>(serEng,(int *)((long)&uStack_28 + 4));
    this->fType = uStack_28._4_4_;
    XSerializeEngine::operator>>(serEng,&this->fDataConverted);
    XSerializeEngine::operator>>(serEng,&this->fDataOverflowed);
    XSerializeEngine::operator>>(serEng,&this->fSign);
    XSerializeEngine::readString(serEng,&this->fRawData);
    this->fFormattedString = (XMLCh *)0x0;
    return;
  }
  XSerializeEngine::operator<<(serEng,this->fValue);
  XSerializeEngine::operator<<(serEng,this->fType);
  XSerializeEngine::operator<<(serEng,this->fDataConverted);
  XSerializeEngine::operator<<(serEng,this->fDataOverflowed);
  XSerializeEngine::operator<<(serEng,this->fSign);
  XSerializeEngine::writeString(serEng,this->fRawData,0,false);
  return;
}

Assistant:

void XMLAbstractDoubleFloat::serialize(XSerializeEngine& serEng)
{
    //REVISIT: may not need to call base since it does nothing
    XMLNumber::serialize(serEng);

    if (serEng.isStoring())
    {
        serEng << fValue;
        serEng << fType;
        serEng << fDataConverted;
        serEng << fDataOverflowed;
        serEng << fSign;

        serEng.writeString(fRawData);

        // Do not serialize fFormattedString

    }
    else
    {
        serEng >> fValue;

        int type = 0;
        serEng >> type;
        fType = (LiteralType) type;

        serEng >> fDataConverted;
        serEng >> fDataOverflowed;
        serEng >> fSign;

        serEng.readString(fRawData);

        // Set it to 0 force it to re-format if needed
        fFormattedString = 0;

    }

}